

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

void __thiscall efsw::String::String(String *this,string *utf8String)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  begin;
  
  (this->mString)._M_dataplus._M_p = (pointer)&(this->mString).field_2;
  (this->mString)._M_string_length = 0;
  (this->mString).field_2._M_local_buf[0] = L'\0';
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  reserve(&this->mString,utf8String->_M_string_length + 1);
  begin._M_current = (utf8String->_M_dataplus)._M_p;
  Utf<8u>::
  ToUtf32<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::back_insert_iterator<std::__cxx11::u32string>>
            (begin,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(begin._M_current + utf8String->_M_string_length),
             (back_insert_iterator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
              )this);
  return;
}

Assistant:

String::String( const std::string& utf8String ) {
	mString.reserve( utf8String.length() + 1 );

	Utf8::ToUtf32( utf8String.begin(), utf8String.end(), std::back_inserter( mString ) );
}